

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_freebsd(int n,u_long *numbers,char **error)

{
  dev_t dev;
  char **error_local;
  u_long *numbers_local;
  int n_local;
  
  dev = 0;
  if (n == 2) {
    dev = (*numbers & 0xff) << 8 | numbers[1] & 0xffff00ff;
    if ((long)(int)((uint)(dev >> 8) & 0xff) != *numbers) {
      *error = "invalid major number";
    }
    if ((long)(int)((uint)dev & 0xffff00ff) != numbers[1]) {
      *error = "invalid minor number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return dev;
}

Assistant:

static dev_t
pack_freebsd(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_freebsd(numbers[0], numbers[1]);
		if ((u_long)major_freebsd(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)minor_freebsd(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}